

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

void HTS_byte_swap(void *p,size_t size,size_t block)

{
  char cVar1;
  size_t j;
  size_t i;
  char tmp;
  char *q;
  size_t block_local;
  size_t size_local;
  void *p_local;
  
  q = (char *)p;
  for (i = 0; i < block; i = i + 1) {
    for (j = 0; j < size >> 1; j = j + 1) {
      cVar1 = q[j];
      q[j] = q[(size - 1) - j];
      q[(size - 1) - j] = cVar1;
    }
    q = q + size;
  }
  return;
}

Assistant:

static void HTS_byte_swap(void *p, size_t size, size_t block)
{
   char *q, tmp;
   size_t i, j;

   q = (char *) p;

   for (i = 0; i < block; i++) {
      for (j = 0; j < (size / 2); j++) {
         tmp = *(q + j);
         *(q + j) = *(q + (size - 1 - j));
         *(q + (size - 1 - j)) = tmp;
      }
      q += size;
   }
}